

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O0

void Acec_DetectComputeSuppOne_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp,Vec_Int_t *vNods)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vNods_local;
  Vec_Int_t *vSupp_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    if ((*(ulong *)pObj >> 0x1e & 1) == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCl.c"
                      ,0xcb,
                      "void Acec_DetectComputeSuppOne_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      pGVar2 = Gia_ObjFanin0(pObj);
      Acec_DetectComputeSuppOne_rec(p,pGVar2,vSupp,vNods);
      pGVar2 = Gia_ObjFanin1(pObj);
      Acec_DetectComputeSuppOne_rec(p,pGVar2,vSupp,vNods);
      iVar1 = Gia_ObjId(p,pObj);
      Vec_IntPush(vNods,iVar1);
    }
    else {
      iVar1 = Gia_ObjId(p,pObj);
      Vec_IntPush(vSupp,iVar1);
    }
  }
  return;
}

Assistant:

void Acec_DetectComputeSuppOne_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp, Vec_Int_t * vNods )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( pObj->fMark0 )
    {
        Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Acec_DetectComputeSuppOne_rec( p, Gia_ObjFanin0(pObj), vSupp, vNods );
    Acec_DetectComputeSuppOne_rec( p, Gia_ObjFanin1(pObj), vSupp, vNods );
    Vec_IntPush( vNods, Gia_ObjId(p, pObj) );
}